

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O2

HRESULT __thiscall
Js::ByteCodeBufferBuilder::AddFunctionBody
          (ByteCodeBufferBuilder *this,BufferBuilderList *builder,FunctionBody *function,
          SRCINFO *srcInfo,SerializedFieldList *definedFields)

{
  code *pcVar1;
  Type TVar2;
  bool bVar3;
  RegexFlags value;
  ushort uVar4;
  ProfileId PVar5;
  RegSlot RVar6;
  uint uVar7;
  int iVar8;
  uint32 debuggerScopeSlotArraySize;
  uint uVar9;
  undefined4 *puVar10;
  LoopHeader *pLVar11;
  AsmJsFunctionInfo *pAVar12;
  PropertyIdArray *propIds;
  AuxArray<unsigned_int> *pAVar13;
  unsigned_short *puVar14;
  RegexPattern *this_00;
  uint i;
  long lVar15;
  int local_60;
  byte local_5c;
  InternalString source;
  
  uVar4 = (ushort)*(uint *)&function->field_0x17c;
  if ((*(uint *)&function->field_0x17c >> 0xb & 1) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar10 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                ,0x82f,"(!function->GetIsSerialized())",
                                "!function->GetIsSerialized()");
    if (!bVar3) goto LAB_007b41a3;
    *puVar10 = 0;
    uVar4 = *(ushort *)&function->field_0x17c;
  }
  *(ushort *)&function->field_0x17c = uVar4 | 0x800;
  RVar6 = FunctionBody::GetConstantCount(function);
  if (RVar6 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar10 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                ,0x833,"(function->GetConstantCount() != 0)",
                                "function->GetConstantCount() != 0");
    if (!bVar3) {
LAB_007b41a3:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar10 = 0;
  }
  RVar6 = FunctionBody::GetVarCount(function);
  if (RVar6 != 0) {
    definedFields->field_0x1 = definedFields->field_0x1 | 4;
    RVar6 = FunctionBody::GetVarCount(function);
    PrependInt32(this,builder,L"VarCount",RVar6,(BufferBuilderInt32 **)0x0);
  }
  RVar6 = FunctionBody::GetConstantCount(function);
  if (RVar6 != 0) {
    definedFields->field_0x1 = definedFields->field_0x1 | 8;
    RVar6 = FunctionBody::GetConstantCount(function);
    PrependInt32(this,builder,L"ConstantCount",RVar6,(BufferBuilderInt32 **)0x0);
  }
  RVar6 = FunctionBody::GetFirstTmpRegister(function);
  PrependInt32(this,builder,L"FirstTmpRegister",RVar6,(BufferBuilderInt32 **)0x0);
  RVar6 = FunctionBody::GetOutParamMaxDepth(function);
  if (RVar6 != 0) {
    definedFields->field_0x1 = definedFields->field_0x1 | 0x10;
    RVar6 = FunctionBody::GetOutParamMaxDepth(function);
    PrependInt32(this,builder,L"OutParamMaxDepth",RVar6,(BufferBuilderInt32 **)0x0);
  }
  uVar7 = FunctionBody::GetByteCodeCount(function);
  PrependInt32(this,builder,L"ByteCodeCount",uVar7,(BufferBuilderInt32 **)0x0);
  uVar7 = FunctionBody::GetByteCodeWithoutLDACount(function);
  PrependInt32(this,builder,L"ByteCodeWithoutLDACount",uVar7,(BufferBuilderInt32 **)0x0);
  uVar7 = FunctionBody::GetByteCodeInLoopCount(function);
  if (uVar7 != 0) {
    definedFields->field_0x1 = definedFields->field_0x1 | 0x20;
    uVar7 = FunctionBody::GetByteCodeInLoopCount(function);
    PrependInt32(this,builder,L"ByteCodeInLoopCount",uVar7,(BufferBuilderInt32 **)0x0);
  }
  if (function->m_envDepth != 0) {
    definedFields->field_0x1 = definedFields->field_0x1 | 0x40;
    PrependInt16(this,builder,L"m_envDepth",function->m_envDepth,(BufferBuilderInt16 **)0x0);
  }
  if (function->m_argUsedForBranch != 0) {
    definedFields->field_0x1 = definedFields->field_0x1 | 0x80;
    PrependInt16(this,builder,L"m_argUsedForBranch",function->m_argUsedForBranch,
                 (BufferBuilderInt16 **)0x0);
  }
  if (function->profiledLdLenCount != 0) {
    definedFields->field_0x2 = definedFields->field_0x2 | 1;
    PrependInt16(this,builder,L"profiledLdLenCount",function->profiledLdLenCount,
                 (BufferBuilderInt16 **)0x0);
  }
  if (function->profiledLdElemCount != 0) {
    definedFields->field_0x2 = definedFields->field_0x2 | 2;
    PrependInt16(this,builder,L"profiledLdElemCount",function->profiledLdElemCount,
                 (BufferBuilderInt16 **)0x0);
  }
  if (function->profiledStElemCount != 0) {
    definedFields->field_0x2 = definedFields->field_0x2 | 4;
    PrependInt16(this,builder,L"profiledStElemCount",function->profiledStElemCount,
                 (BufferBuilderInt16 **)0x0);
  }
  if (function->profiledCallSiteCount != 0) {
    definedFields->field_0x2 = definedFields->field_0x2 | 8;
    PrependInt16(this,builder,L"profiledCallSiteCount",function->profiledCallSiteCount,
                 (BufferBuilderInt16 **)0x0);
  }
  if (function->profiledArrayCallSiteCount != 0) {
    definedFields->field_0x2 = definedFields->field_0x2 | 0x10;
    PrependInt16(this,builder,L"profiledArrayCallSiteCount",function->profiledArrayCallSiteCount,
                 (BufferBuilderInt16 **)0x0);
  }
  if (function->profiledDivOrRemCount != 0) {
    definedFields->field_0x2 = definedFields->field_0x2 | 0x20;
    PrependInt16(this,builder,L"profiledDivOrRemCount",function->profiledDivOrRemCount,
                 (BufferBuilderInt16 **)0x0);
  }
  if (function->profiledSwitchCount != 0) {
    definedFields->field_0x2 = definedFields->field_0x2 | 0x40;
    PrependInt16(this,builder,L"profiledSwitchCount",function->profiledSwitchCount,
                 (BufferBuilderInt16 **)0x0);
  }
  if (function->profiledReturnTypeCount != 0) {
    definedFields->field_0x2 = definedFields->field_0x2 | 0x80;
    PrependInt16(this,builder,L"profiledReturnTypeCount",function->profiledReturnTypeCount,
                 (BufferBuilderInt16 **)0x0);
  }
  if (function->profiledSlotCount != 0) {
    definedFields->field_0x3 = definedFields->field_0x3 | 1;
    PrependInt16(this,builder,L"profiledSlotCount",function->profiledSlotCount,
                 (BufferBuilderInt16 **)0x0);
  }
  uVar7 = FunctionBody::GetLoopCount(function);
  if (uVar7 != 0) {
    definedFields->field_0x3 = definedFields->field_0x3 | 2;
    uVar7 = FunctionBody::GetLoopCount(function);
    PrependInt32(this,builder,L"LoopCount",uVar7,(BufferBuilderInt32 **)0x0);
  }
  if (function->m_hasFinally == true) {
    definedFields->field_0x3 = definedFields->field_0x3 | 4;
    PrependBool(this,builder,L"m_hasFinally",function->m_hasFinally);
  }
  if (function->hasScopeObject == true) {
    definedFields->field_0x3 = definedFields->field_0x3 | 8;
    PrependBool(this,builder,L"hasScopeObject",function->hasScopeObject);
  }
  if (function->hasCachedScopePropIds == true) {
    definedFields->field_0x3 = definedFields->field_0x3 | 0x10;
    PrependBool(this,builder,L"hasCachedScopePropIds",function->hasCachedScopePropIds);
  }
  uVar7 = FunctionBody::GetForInLoopDepth(function);
  if (uVar7 != 0) {
    definedFields->field_0x3 = definedFields->field_0x3 | 0x20;
    uVar7 = FunctionBody::GetForInLoopDepth(function);
    PrependInt32(this,builder,L"ForInLoopDepth",uVar7,(BufferBuilderInt32 **)0x0);
  }
  uVar7 = FunctionBody::GetInlineCacheCount(function);
  if (uVar7 != 0) {
    definedFields->field_0x3 = definedFields->field_0x3 | 0x40;
    uVar7 = FunctionBody::GetInlineCacheCount(function);
    PrependInt32(this,builder,L"InlineCacheCount",uVar7,(BufferBuilderInt32 **)0x0);
  }
  uVar7 = FunctionBody::GetRootObjectLoadInlineCacheStart(function);
  if (uVar7 != 0) {
    definedFields->field_0x3 = definedFields->field_0x3 | 0x80;
    uVar7 = FunctionBody::GetRootObjectLoadInlineCacheStart(function);
    PrependInt32(this,builder,L"RootObjectLoadInlineCacheStart",uVar7,(BufferBuilderInt32 **)0x0);
  }
  uVar7 = FunctionBody::GetRootObjectLoadMethodInlineCacheStart(function);
  if (uVar7 != 0) {
    definedFields->field_0x4 = definedFields->field_0x4 | 1;
    uVar7 = FunctionBody::GetRootObjectLoadMethodInlineCacheStart(function);
    PrependInt32(this,builder,L"RootObjectLoadMethodInlineCacheStart",uVar7,
                 (BufferBuilderInt32 **)0x0);
  }
  uVar7 = FunctionBody::GetRootObjectStoreInlineCacheStart(function);
  if (uVar7 != 0) {
    definedFields->field_0x4 = definedFields->field_0x4 | 2;
    uVar7 = FunctionBody::GetRootObjectStoreInlineCacheStart(function);
    PrependInt32(this,builder,L"RootObjectStoreInlineCacheStart",uVar7,(BufferBuilderInt32 **)0x0);
  }
  uVar7 = FunctionBody::GetIsInstInlineCacheCount(function);
  if (uVar7 != 0) {
    definedFields->field_0x4 = definedFields->field_0x4 | 4;
    uVar7 = FunctionBody::GetIsInstInlineCacheCount(function);
    PrependInt32(this,builder,L"IsInstInlineCacheCount",uVar7,(BufferBuilderInt32 **)0x0);
  }
  uVar7 = FunctionBody::GetReferencedPropertyIdCount(function);
  if (uVar7 != 0) {
    definedFields->field_0x4 = definedFields->field_0x4 | 8;
    uVar7 = FunctionBody::GetReferencedPropertyIdCount(function);
    PrependInt32(this,builder,L"ReferencedPropertyIdCount",uVar7,(BufferBuilderInt32 **)0x0);
  }
  uVar7 = FunctionBody::GetObjLiteralCount(function);
  if (uVar7 != 0) {
    definedFields->field_0x4 = definedFields->field_0x4 | 0x10;
    uVar7 = FunctionBody::GetObjLiteralCount(function);
    PrependInt32(this,builder,L"ObjLiteralCount",uVar7,(BufferBuilderInt32 **)0x0);
  }
  uVar7 = FunctionBody::GetLiteralRegexCount(function);
  if (uVar7 != 0) {
    definedFields->field_0x4 = definedFields->field_0x4 | 0x20;
    uVar7 = FunctionBody::GetLiteralRegexCount(function);
    PrependInt32(this,builder,L"LiteralRegexCount",uVar7,(BufferBuilderInt32 **)0x0);
  }
  uVar7 = FunctionBody::GetInnerScopeCount(function);
  if (uVar7 != 0) {
    definedFields->field_0x4 = definedFields->field_0x4 | 0x40;
    uVar7 = FunctionBody::GetInnerScopeCount(function);
    PrependInt32(this,builder,L"InnerScopeCount",uVar7,(BufferBuilderInt32 **)0x0);
  }
  PVar5 = FunctionBody::GetProfiledCallApplyCallSiteCount(function);
  if (PVar5 != 0) {
    definedFields->field_0x4 = definedFields->field_0x4 | 0x80;
    PVar5 = FunctionBody::GetProfiledCallApplyCallSiteCount(function);
    PrependInt16(this,builder,L"ProfiledCallApplyCallSiteCount",PVar5,(BufferBuilderInt16 **)0x0);
  }
  PVar5 = FunctionBody::GetProfiledForInLoopCount(function);
  if (PVar5 != 0) {
    definedFields->field_0x5 = definedFields->field_0x5 | 1;
    PVar5 = FunctionBody::GetProfiledForInLoopCount(function);
    PrependInt16(this,builder,L"ProfiledForInLoopCount",PVar5,(BufferBuilderInt16 **)0x0);
  }
  RVar6 = FunctionBody::GetLocalClosureRegister(function);
  if (RVar6 != 0xffffffff) {
    definedFields->field_0x5 = definedFields->field_0x5 | 2;
    RVar6 = FunctionBody::GetLocalClosureRegister(function);
    PrependInt32(this,builder,L"LocalClosureRegister",RVar6,(BufferBuilderInt32 **)0x0);
  }
  RVar6 = FunctionBody::GetParamClosureRegister(function);
  if (RVar6 != 0xffffffff) {
    definedFields->field_0x5 = definedFields->field_0x5 | 4;
    RVar6 = FunctionBody::GetParamClosureRegister(function);
    PrependInt32(this,builder,L"ParamClosureRegister",RVar6,(BufferBuilderInt32 **)0x0);
  }
  RVar6 = FunctionBody::GetLocalFrameDisplayRegister(function);
  if (RVar6 != 0xffffffff) {
    definedFields->field_0x5 = definedFields->field_0x5 | 8;
    RVar6 = FunctionBody::GetLocalFrameDisplayRegister(function);
    PrependInt32(this,builder,L"LocalFrameDisplayRegister",RVar6,(BufferBuilderInt32 **)0x0);
  }
  RVar6 = FunctionBody::GetEnvRegister(function);
  if (RVar6 != 0xffffffff) {
    definedFields->field_0x5 = definedFields->field_0x5 | 0x10;
    RVar6 = FunctionBody::GetEnvRegister(function);
    PrependInt32(this,builder,L"EnvRegister",RVar6,(BufferBuilderInt32 **)0x0);
  }
  RVar6 = FunctionBody::GetThisRegisterForEventHandler(function);
  if (RVar6 != 0xffffffff) {
    definedFields->field_0x5 = definedFields->field_0x5 | 0x20;
    RVar6 = FunctionBody::GetThisRegisterForEventHandler(function);
    PrependInt32(this,builder,L"ThisRegisterForEventHandler",RVar6,(BufferBuilderInt32 **)0x0);
  }
  RVar6 = FunctionBody::GetFirstInnerScopeRegister(function);
  if (RVar6 != 0xffffffff) {
    definedFields->field_0x5 = definedFields->field_0x5 | 0x40;
    RVar6 = FunctionBody::GetFirstInnerScopeRegister(function);
    PrependInt32(this,builder,L"FirstInnerScopeRegister",RVar6,(BufferBuilderInt32 **)0x0);
  }
  RVar6 = FunctionBody::GetFuncExprScopeRegister(function);
  if (RVar6 != 0xffffffff) {
    definedFields->field_0x5 = definedFields->field_0x5 | 0x80;
    RVar6 = FunctionBody::GetFuncExprScopeRegister(function);
    PrependInt32(this,builder,L"FuncExprScopeRegister",RVar6,(BufferBuilderInt32 **)0x0);
  }
  source.m_content.ptr = (char16_t *)builder;
  pLVar11 = FunctionProxy::GetAuxPtr<(Js::FunctionProxy::AuxPointerType)10,Js::LoopHeader*>
                      ((FunctionProxy *)function);
  if (pLVar11 != (LoopHeader *)0x0) {
    definedFields->field_0x6 = definedFields->field_0x6 | 0x10;
    uVar7 = FunctionBody::GetLoopCount(function);
    for (lVar15 = 0; TVar2.ptr = source.m_content.ptr, (ulong)uVar7 * 0x30 - lVar15 != 0;
        lVar15 = lVar15 + 0x30) {
      PrependInt32(this,(BufferBuilderList *)source.m_content.ptr,L"Loop Header Start",
                   *(int *)((long)&pLVar11->startOffset + lVar15),(BufferBuilderInt32 **)0x0);
      PrependInt32(this,(BufferBuilderList *)TVar2.ptr,L"Loop Header End",
                   *(int *)((long)&pLVar11->endOffset + lVar15),(BufferBuilderInt32 **)0x0);
    }
  }
  pAVar12 = FunctionProxy::GetAuxPtr<(Js::FunctionProxy::AuxPointerType)2,Js::AsmJsFunctionInfo*>
                      ((FunctionProxy *)function);
  TVar2 = source.m_content;
  if (pAVar12 == (AsmJsFunctionInfo *)0x0) {
    if (((function->super_ParseableFunctionInfo).super_FunctionProxy.field_0x46 & 2) != 0) {
      definedFields->field_0x6 = definedFields->field_0x6 | 0x20;
      PrependByte(this,(BufferBuilderList *)source.m_content.ptr,L"Asm.js Info Kind",'\x02');
      AddAsmJsModuleInfo(this,(BufferBuilderList *)TVar2.ptr,function);
    }
  }
  else {
    definedFields->field_0x6 = definedFields->field_0x6 | 0x20;
    PrependByte(this,(BufferBuilderList *)source.m_content.ptr,L"Asm.js Info Kind",'\x01');
    AddAsmJsFunctionInfo(this,(BufferBuilderList *)TVar2.ptr,function);
  }
  if (((function->super_ParseableFunctionInfo).super_FunctionProxy.field_0x46 & 4) == 0) {
    AddConstantTable(this,(BufferBuilderList *)TVar2.ptr,function);
    iVar8 = RewriteByteCodesInto
                      (this,(BufferBuilderList *)TVar2.ptr,L"Rewritten Byte Code",function,
                       (function->byteCodeBlock).ptr,definedFields);
  }
  else {
    AddAsmJsConstantTable(this,(BufferBuilderList *)TVar2.ptr,function);
    iVar8 = RewriteAsmJsByteCodesInto
                      (this,(BufferBuilderList *)TVar2.ptr,L"Rewritten Asm.js Byte Code",function,
                       (function->byteCodeBlock).ptr,definedFields);
  }
  if (-1 < iVar8) {
    propIds = FunctionBody::GetFormalsPropIdArray(function,false);
    if (propIds != (PropertyIdArray *)0x0) {
      definedFields->field_0x6 = definedFields->field_0x6 | 0x80;
      AddPropertyIdOfFormals(this,(BufferBuilderList *)TVar2.ptr,propIds,function);
    }
    AddCacheIdToPropertyIdMap(this,(BufferBuilderList *)TVar2.ptr,function);
    AddReferencedPropertyIdMap(this,(BufferBuilderList *)TVar2.ptr,function);
    pAVar13 = FunctionProxy::
              GetAuxPtr<(Js::FunctionProxy::AuxPointerType)23,Js::AuxArray<unsigned_int>*>
                        ((FunctionProxy *)function);
    if (pAVar13 == (AuxArray<unsigned_int> *)0x0) {
      *definedFields = (SerializedFieldList)((ulong)*definedFields & 0xfeffffffffffffff);
    }
    else {
      *definedFields = (SerializedFieldList)((ulong)*definedFields | 0x100000000000000);
      AddSlotIdInCachedScopeToNestedIndexArray(this,(BufferBuilderList *)TVar2.ptr,function);
    }
    puVar14 = FunctionProxy::GetAuxPtr<(Js::FunctionProxy::AuxPointerType)27,unsigned_short*>
                        ((FunctionProxy *)function);
    if (puVar14 == (unsigned_short *)0x0) {
      *definedFields = (SerializedFieldList)((ulong)*definedFields & 0xfdffffffffffffff);
    }
    else {
      *definedFields = (SerializedFieldList)((ulong)*definedFields | 0x200000000000000);
      AddCallSiteToCallApplyCallSiteArray(this,(BufferBuilderList *)TVar2.ptr,function);
    }
    debuggerScopeSlotArraySize = GetDebuggerScopeSlotArrayCount(this,function);
    if (debuggerScopeSlotArraySize != 0) {
      definedFields->field_0x7 = definedFields->field_0x7 | 4;
      PrependInt32(this,(BufferBuilderList *)TVar2.ptr,L"Debugger Scope Slot Array Size",
                   debuggerScopeSlotArraySize,(BufferBuilderInt32 **)0x0);
      AddSlotArrayDebuggerScopes
                (this,(BufferBuilderList *)TVar2.ptr,function,debuggerScopeSlotArraySize);
    }
    uVar7 = 0;
    while( true ) {
      uVar9 = FunctionBody::GetLiteralRegexCount(function);
      if (uVar9 <= uVar7) break;
      this_00 = FunctionBody::GetLiteralRegex(function,uVar7);
      if (this_00 == (RegexPattern *)0x0) {
        PrependInt32(this,(BufferBuilderList *)TVar2.ptr,L"Literal regex source length",-1,
                     (BufferBuilderInt32 **)0x0);
      }
      else {
        UnifiedRegex::RegexPattern::GetSource((RegexPattern *)&local_60);
        PrependInt32(this,(BufferBuilderList *)TVar2.ptr,L"Literal regex source length",local_60,
                     (BufferBuilderInt32 **)0x0);
        PrependString16(this,(BufferBuilderList *)TVar2.ptr,L"Literal regex source",
                        (LPCWSTR)((ulong)((uint)local_5c * 2) + source._0_8_),local_60 * 2 + 2);
        value = UnifiedRegex::RegexPattern::GetFlags(this_00);
        PrependByte(this,(BufferBuilderList *)TVar2.ptr,L"Literal regex flags",value);
      }
      uVar7 = uVar7 + 1;
    }
    PrependSmallSpanSequence
              (this,(BufferBuilderList *)TVar2.ptr,L"Span Sequence",
               (function->m_sourceInfo).pSpanSequence);
    iVar8 = 0;
  }
  return iVar8;
}

Assistant:

HRESULT AddFunctionBody(BufferBuilderList &builder, FunctionBody *function, SRCINFO const *srcInfo, SerializedFieldList& definedFields)
    {
        Assert(!function->GetIsSerialized());
        DebugOnly(function->SetIsSerialized(true));

        // This field should always be non-zero
        Assert(function->GetConstantCount() != 0);

#define PrependArgSlot PrependInt16
#define PrependRegSlot PrependInt32
#define PrependCharCount PrependInt32
#define PrependULong PrependInt32
#define PrependUInt16 PrependInt16
#define PrependUInt32 PrependInt32

        {
#define DEFINE_FUNCTION_BODY_FIELDS 1
#define DECLARE_SERIALIZABLE_FIELD(type, name, serializableType) \
            if (function->##name != 0) { \
                definedFields.has_##name = true; \
                Prepend##serializableType(builder, _u(#name), function->##name); \
            }

#define DECLARE_SERIALIZABLE_ACCESSOR_FIELD_NO_CHECK(type, name, serializableType) \
            Prepend##serializableType(builder, _u(#name), function->Get##name##());

#define DECLARE_SERIALIZABLE_ACCESSOR_FIELD(type, name, serializableType, defaultValue) \
            if (function->Get##name##() != defaultValue) { \
                definedFields.has_##name = true; \
                DECLARE_SERIALIZABLE_ACCESSOR_FIELD_NO_CHECK(type, name, serializableType); \
            }

#include "SerializableFunctionFields.h"
        }

        {
            auto loopHeaderArray = function->GetLoopHeaderArray();
            if (loopHeaderArray != nullptr)
            {
                definedFields.has_loopHeaderArray = true;
                uint loopCount = function->GetLoopCount();
                for (uint i = 0; i < loopCount; ++i)
                {
                    PrependInt32(builder, _u("Loop Header Start"), loopHeaderArray[i].startOffset);
                    PrependInt32(builder, _u("Loop Header End"), loopHeaderArray[i].endOffset);
                }
            }

#ifdef ASMJS_PLAT
            if (function->GetAsmJsFunctionInfo())
            {
                definedFields.has_asmJsInfo = true;
                PrependByte(builder, _u("Asm.js Info Kind"), 1);
                AddAsmJsFunctionInfo(builder, function);
            }
            else if (function->GetIsAsmjsMode())
            {
                definedFields.has_asmJsInfo = true;
                PrependByte(builder, _u("Asm.js Info Kind"), 2);
                AddAsmJsModuleInfo(builder, function);
            }
#endif

#ifdef ASMJS_PLAT
            if (function->GetIsAsmJsFunction())
            {
                AddAsmJsConstantTable(builder, function);
                auto hr = RewriteAsmJsByteCodesInto(builder, _u("Rewritten Asm.js Byte Code"), function, function->byteCodeBlock, definedFields);
                if (FAILED(hr))
                {
                    return hr;
                }
            }
            else
#endif
            {
                AddConstantTable(builder, function);
                auto hr = RewriteByteCodesInto(builder, _u("Rewritten Byte Code"), function, function->byteCodeBlock, definedFields);
                if (FAILED(hr))
                {
                    return hr;
                }
            }

            PropertyIdArray * propIds = function->GetFormalsPropIdArray(false);
            if (propIds != nullptr)
            {
                definedFields.has_propertyIdOfFormals = true;
                AddPropertyIdOfFormals(builder, propIds, function);
            }

            AddCacheIdToPropertyIdMap(builder, function);
            AddReferencedPropertyIdMap(builder, function);

            if (function->GetSlotIdInCachedScopeToNestedIndexArray() == nullptr)
            {
                definedFields.has_slotIdInCachedScopeToNestedIndexArray = false;
            }
            else
            {
                definedFields.has_slotIdInCachedScopeToNestedIndexArray = true;
                AddSlotIdInCachedScopeToNestedIndexArray(builder, function);
            }

#if ENABLE_NATIVE_CODEGEN
            if (function->GetCallSiteToCallApplyCallSiteArray() == nullptr)
            {
                definedFields.has_callSiteToCallApplyCallSiteArray = false;
            }
            else
            {
                definedFields.has_callSiteToCallApplyCallSiteArray = true;
                AddCallSiteToCallApplyCallSiteArray(builder, function);
            }
#else
            definedFields.has_callSiteToCallApplyCallSiteArray = false;
#endif

            uint debuggerScopeSlotArraySize = GetDebuggerScopeSlotArrayCount(function);
            if (debuggerScopeSlotArraySize != 0)
            {
                definedFields.has_debuggerScopeSlotArray = true;
                PrependInt32(builder, _u("Debugger Scope Slot Array Size"), debuggerScopeSlotArraySize);
                AddSlotArrayDebuggerScopes(builder, function, debuggerScopeSlotArraySize);
            }

            // Literal regexes
            for (uint i = 0; i < function->GetLiteralRegexCount(); ++i)
            {
                const auto literalRegex = function->GetLiteralRegex(i);
                if (!literalRegex)
                {
                    PrependInt32(builder, _u("Literal regex source length"), -1);
                    continue;
                }

                const auto source = literalRegex->GetSource();
                PrependInt32(builder, _u("Literal regex source length"), source.GetLength());
                PrependString16(builder, _u("Literal regex source"), source.GetBuffer(), (source.GetLength() + 1) * sizeof(char16));
                PrependByte(builder, _u("Literal regex flags"), literalRegex->GetFlags());
            }

            // Write the SourceInfo stuff
            PrependSmallSpanSequence(builder, _u("Span Sequence"), function->m_sourceInfo.pSpanSequence);
        }

        return S_OK;
    }